

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool __thiscall wallet::WalletInit::ParameterInteraction(WalletInit *this)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  bool bVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer args;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8 [2];
  allocator<char> local_b8 [32];
  allocator<char> local_98 [32];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-disablewallet",(allocator<char> *)&local_78);
  bVar2 = ArgsManager::GetBoolArg(&gArgs,&log_msg,false);
  std::__cxx11::string::~string((string *)&log_msg);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-wallet",(allocator<char> *)&local_78);
    ArgsManager::GetArgs(local_f8,&gArgs,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    for (args = local_f8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        args != local_f8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; args = args + 1) {
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[21],std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)
                   "%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n",
                   "ParameterInteraction",(char (*) [21])args,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar3 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x58;
        local_78._M_string_length = 0x6deaaf;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/init.cpp"
        ;
        source_file._M_len = 0x58;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "ParameterInteraction";
        logging_function._M_len = 0x14;
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69891e;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x70,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_f8);
    goto LAB_00396f31;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&log_msg,"-blocksonly",local_98);
  bVar2 = ArgsManager::GetBoolArg(&gArgs,&log_msg,false);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-walletbroadcast",local_b8);
    bVar2 = ArgsManager::SoftSetBoolArg(&gArgs,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&log_msg);
    if (!bVar2) goto LAB_00396f31;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar3);
    if (!bVar2) goto LAB_00396f31;
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<char[21]>
              (&local_78,"%s: parameter interaction: -blocksonly=1 -> setting -walletbroadcast=0\n",
               (char (*) [21])0x69891e);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pLVar3 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x58;
    local_78._M_string_length = 0x6deaaf;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/init.cpp";
    source_file_00._M_len = 0x58;
    str_00._M_str = log_msg._M_dataplus._M_p;
    str_00._M_len = log_msg._M_string_length;
    logging_function_00._M_str = "ParameterInteraction";
    logging_function_00._M_len = 0x14;
    BCLog::Logger::LogPrintStr(pLVar3,str_00,logging_function_00,source_file_00,0x77,ALL,Info);
  }
  std::__cxx11::string::~string((string *)&log_msg);
LAB_00396f31:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletInit::ParameterInteraction() const
{
#ifdef USE_BDB
     if (!BerkeleyDatabaseSanityCheck()) {
         return InitError(Untranslated("A version conflict was detected between the run-time BerkeleyDB library and the one used during compilation."));
     }
#endif
    if (gArgs.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        for (const std::string& wallet : gArgs.GetArgs("-wallet")) {
            LogPrintf("%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n", __func__, wallet);
        }

        return true;
    }

    if (gArgs.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY) && gArgs.SoftSetBoolArg("-walletbroadcast", false)) {
        LogPrintf("%s: parameter interaction: -blocksonly=1 -> setting -walletbroadcast=0\n", __func__);
    }

    return true;
}